

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cache.c
# Opt level: O1

int mbedtls_ssl_cache_get(void *data,mbedtls_ssl_session *session)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  time_t tVar9;
  mbedtls_x509_crt *crt;
  int *piVar10;
  
  tVar9 = time((time_t *)0x0);
  if (*data != (int *)0x0) {
    iVar8 = *(int *)((long)data + 8);
    piVar10 = *data;
    do {
      piVar1 = *(int **)(piVar10 + 0x2e);
      if ((((iVar8 == 0) || ((int)tVar9 - *piVar10 <= iVar8)) &&
          (session->ciphersuite == piVar10[4])) &&
         (((session->compression == piVar10[5] && (session->id_len == *(size_t *)(piVar10 + 6))) &&
          (iVar7 = bcmp(session->id,piVar10 + 8,*(size_t *)(piVar10 + 6)), iVar7 == 0)))) {
        uVar2 = *(undefined8 *)(piVar10 + 0x10);
        uVar3 = *(undefined8 *)(piVar10 + 0x12);
        uVar4 = *(undefined8 *)(piVar10 + 0x14);
        uVar5 = *(undefined8 *)(piVar10 + 0x16);
        uVar6 = *(undefined8 *)(piVar10 + 0x1a);
        *(undefined8 *)(session->master + 0x20) = *(undefined8 *)(piVar10 + 0x18);
        *(undefined8 *)(session->master + 0x28) = uVar6;
        *(undefined8 *)(session->master + 0x10) = uVar4;
        *(undefined8 *)(session->master + 0x18) = uVar5;
        *(undefined8 *)session->master = uVar2;
        *(undefined8 *)(session->master + 8) = uVar3;
        session->verify_result = piVar10[0x1e];
        if (*(long *)(piVar10 + 0x2c) == 0) {
          return 0;
        }
        crt = (mbedtls_x509_crt *)calloc(1,0x228);
        session->peer_cert = crt;
        if (crt == (mbedtls_x509_crt *)0x0) {
          return 1;
        }
        mbedtls_x509_crt_init(crt);
        iVar8 = mbedtls_x509_crt_parse
                          (session->peer_cert,*(uchar **)(piVar10 + 0x2c),
                           *(size_t *)(piVar10 + 0x2a));
        if (iVar8 != 0) {
          free(session->peer_cert);
          session->peer_cert = (mbedtls_x509_crt *)0x0;
          return 1;
        }
        return 0;
      }
      piVar10 = piVar1;
    } while (piVar1 != (int *)0x0);
  }
  return 1;
}

Assistant:

int mbedtls_ssl_cache_get( void *data, mbedtls_ssl_session *session )
{
    int ret = 1;
#if defined(MBEDTLS_HAVE_TIME)
    mbedtls_time_t t = mbedtls_time( NULL );
#endif
    mbedtls_ssl_cache_context *cache = (mbedtls_ssl_cache_context *) data;
    mbedtls_ssl_cache_entry *cur, *entry;

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_lock( &cache->mutex ) != 0 )
        return( 1 );
#endif

    cur = cache->chain;
    entry = NULL;

    while( cur != NULL )
    {
        entry = cur;
        cur = cur->next;

#if defined(MBEDTLS_HAVE_TIME)
        if( cache->timeout != 0 &&
            (int) ( t - entry->timestamp ) > cache->timeout )
            continue;
#endif

        if( session->ciphersuite != entry->session.ciphersuite ||
            session->compression != entry->session.compression ||
            session->id_len != entry->session.id_len )
            continue;

        if( memcmp( session->id, entry->session.id,
                    entry->session.id_len ) != 0 )
            continue;

        memcpy( session->master, entry->session.master, 48 );

        session->verify_result = entry->session.verify_result;

#if defined(MBEDTLS_X509_CRT_PARSE_C)
        /*
         * Restore peer certificate (without rest of the original chain)
         */
        if( entry->peer_cert.p != NULL )
        {
            if( ( session->peer_cert = mbedtls_calloc( 1,
                                 sizeof(mbedtls_x509_crt) ) ) == NULL )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_x509_crt_init( session->peer_cert );
            if( mbedtls_x509_crt_parse( session->peer_cert, entry->peer_cert.p,
                                entry->peer_cert.len ) != 0 )
            {
                mbedtls_free( session->peer_cert );
                session->peer_cert = NULL;
                ret = 1;
                goto exit;
            }
        }
#endif /* MBEDTLS_X509_CRT_PARSE_C */

        ret = 0;
        goto exit;
    }

exit:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &cache->mutex ) != 0 )
        ret = 1;
#endif

    return( ret );
}